

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeNVE.cpp
# Opt level: O0

void __thiscall OpenMD::FluctuatingChargeNVE::initialize(FluctuatingChargeNVE *this)

{
  bool bVar1;
  Snapshot *in_RDI;
  pointer pVVar2;
  FluctuatingChargePropagator *in_stack_00000140;
  pair<double,_double> *eTherm;
  
  FluctuatingChargePropagator::initialize(in_stack_00000140);
  if (((ulong)(in_RDI->atomData).velocity.
              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage & 1) != 0) {
    SimInfo::getSimParams
              ((SimInfo *)
               (in_RDI->atomData).velocity.
               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    bVar1 = Globals::haveDt((Globals *)0x2ffebd);
    if (bVar1) {
      SimInfo::getSimParams
                ((SimInfo *)
                 (in_RDI->atomData).velocity.
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      pVVar2 = (pointer)Globals::getDt((Globals *)0x2ffed9);
      (in_RDI->atomData).force.
      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl
      .super__Vector_impl_data._M_finish = pVVar2;
      (in_RDI->atomData).force.
      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl
      .super__Vector_impl_data._M_start =
           (pointer)((double)(in_RDI->atomData).force.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish * 0.5);
    }
    else {
      snprintf(painCave.errMsg,2000,"FluctuatingChargeNVE Error: dt is not set\n");
      painCave.isFatal = 1;
      simError();
    }
    SimInfo::getSimParams
              ((SimInfo *)
               (in_RDI->atomData).velocity.
               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    bVar1 = Globals::getUseIntialExtendedSystemState((Globals *)0x2fff3d);
    if (!bVar1) {
      eTherm = (pair<double,_double> *)
               (in_RDI->atomData).force.
               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::make_pair<double,double>((double *)in_RDI,(double *)eTherm);
      Snapshot::setElectronicThermostat(in_RDI,eTherm);
    }
  }
  return;
}

Assistant:

void FluctuatingChargeNVE::initialize() {
    FluctuatingChargePropagator::initialize();
    if (hasFlucQ_) {
      if (info_->getSimParams()->haveDt()) {
        dt_  = info_->getSimParams()->getDt();
        dt2_ = dt_ * 0.5;
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "FluctuatingChargeNVE Error: dt is not set\n");
        painCave.isFatal = 1;
        simError();
      }

      if (!info_->getSimParams()->getUseIntialExtendedSystemState()) {
        snap->setElectronicThermostat(make_pair(0.0, 0.0));
      }
    }
  }